

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_musig_compute_noncehash_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0x2c7d5a45;
  sha->s[1] = 0x6bf7e53;
  sha->s[2] = 0x89be68a6;
  sha->s[3] = 0x971254c0;
  sha->s[4] = 0x60ac12d2;
  sha->s[5] = 0x72846dcd;
  sha->s[6] = 0x6c81212f;
  sha->s[7] = 0xde7a2500;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_musig_compute_noncehash_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x2c7d5a45ul;
    sha->s[1] = 0x06bf7e53ul;
    sha->s[2] = 0x89be68a6ul;
    sha->s[3] = 0x971254c0ul;
    sha->s[4] = 0x60ac12d2ul;
    sha->s[5] = 0x72846dcdul;
    sha->s[6] = 0x6c81212ful;
    sha->s[7] = 0xde7a2500ul;
    sha->bytes = 64;
}